

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprAnalyzeAggList(NameContext *pNC,ExprList *pList)

{
  int *in_RSI;
  Expr *in_stack_00000008;
  int i;
  ExprList_item *pItem;
  undefined4 local_1c;
  
  if (in_RSI != (int *)0x0) {
    for (local_1c = 0; local_1c < *in_RSI; local_1c = local_1c + 1) {
      sqlite3ExprAnalyzeAggregates((NameContext *)pItem,in_stack_00000008);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAnalyzeAggList(NameContext *pNC, ExprList *pList){
  struct ExprList_item *pItem;
  int i;
  if( pList ){
    for(pItem=pList->a, i=0; i<pList->nExpr; i++, pItem++){
      sqlite3ExprAnalyzeAggregates(pNC, pItem->pExpr);
    }
  }
}